

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O3

int Gia_ManHashAndMulti(Gia_Man_t *p,Vec_Int_t *vLits)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  iVar4 = vLits->nSize;
  if (iVar4 == 0) {
    iVar4 = 0;
  }
  else {
    while (1 < iVar4) {
      piVar3 = vLits->pArray;
      iVar4 = 1;
      lVar6 = 0;
      do {
        lVar5 = lVar6;
        iVar1 = Gia_ManHashAnd(p,piVar3[lVar5 * 2],piVar3[lVar5 * 2 + 1]);
        if (vLits->nSize <= lVar5) goto LAB_0020ba0f;
        piVar3 = vLits->pArray;
        piVar3[lVar5] = iVar1;
        lVar6 = lVar5 + 1;
        uVar2 = vLits->nSize;
        iVar4 = iVar4 + 2;
      } while (iVar4 < (int)uVar2);
      if ((uVar2 & 1) != 0) {
        if ((int)uVar2 < 1) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
        }
        if (uVar2 <= (uint)lVar6) {
LAB_0020ba0f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        vLits->pArray[lVar6] = vLits->pArray[(ulong)uVar2 - 1];
        lVar6 = lVar5 + 2;
        uVar2 = vLits->nSize;
      }
      iVar4 = (int)lVar6;
      if ((int)uVar2 < iVar4) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
      }
      vLits->nSize = iVar4;
    }
    if (iVar4 != 1) {
      __assert_fail("Vec_IntSize(vLits) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                    ,799,"int Gia_ManHashAndMulti(Gia_Man_t *, Vec_Int_t *)");
    }
    iVar4 = *vLits->pArray;
  }
  return iVar4;
}

Assistant:

int Gia_ManHashAndMulti( Gia_Man_t * p, Vec_Int_t * vLits )
{
    if ( Vec_IntSize(vLits) == 0 )
        return 0;
    while ( Vec_IntSize(vLits) > 1 )
    {
        int i, k = 0, Lit1, Lit2, LitRes;
        Vec_IntForEachEntryDouble( vLits, Lit1, Lit2, i )
        {
            LitRes = Gia_ManHashAnd( p, Lit1, Lit2 );
            Vec_IntWriteEntry( vLits, k++, LitRes );
        }
        if ( Vec_IntSize(vLits) & 1 )
            Vec_IntWriteEntry( vLits, k++, Vec_IntEntryLast(vLits) );
        Vec_IntShrink( vLits, k );
    }
    assert( Vec_IntSize(vLits) == 1 );
    return Vec_IntEntry(vLits, 0);
}